

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

int __thiscall
ADPlanner::CreateSearchStateSpace(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace)

{
  CHeap *this_00;
  CList *pCVar1;
  
  this_00 = (CHeap *)operator_new(0x18);
  CHeap::CHeap(this_00);
  pSearchStateSpace->heap = this_00;
  pCVar1 = (CList *)operator_new(0x18);
  pCVar1->firstelement = (listelement *)0x0;
  pCVar1->lastelement = (listelement *)0x0;
  pCVar1->currentsize = 0;
  pSearchStateSpace->inconslist = pCVar1;
  this->MaxMemoryCounter = this->MaxMemoryCounter + 0x30;
  pSearchStateSpace->searchgoalstate = (CMDPSTATE *)0x0;
  pSearchStateSpace->searchstartstate = (CMDPSTATE *)0x0;
  this->searchexpands = 0;
  pSearchStateSpace->bReinitializeSearchStateSpace = false;
  return 1;
}

Assistant:

int ADPlanner::CreateSearchStateSpace(ADSearchStateSpace_t* pSearchStateSpace)
{
    //create a heap
    pSearchStateSpace->heap = new CHeap;
    pSearchStateSpace->inconslist = new CList;
    MaxMemoryCounter += sizeof(CHeap);
    MaxMemoryCounter += sizeof(CList);

    pSearchStateSpace->searchgoalstate = NULL;
    pSearchStateSpace->searchstartstate = NULL;

    searchexpands = 0;

    pSearchStateSpace->bReinitializeSearchStateSpace = false;

    return 1;
}